

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int CollectionStore(unqlite_col *pCol,jx9_value *pValue)

{
  SyBlob *pBlob;
  uint uVar1;
  unqlite *pDb;
  unqlite_kv_engine *puVar2;
  unqlite_kv_methods *puVar3;
  void *pvVar4;
  sxi32 sVar5;
  long iTotal;
  long iRec;
  jx9_value sId;
  
  pDb = pCol->pVm->pDb;
  if (pCol->nTotRec == 0x7fffffffffffffff) {
    unqliteGenErrorFormat(pDb,"Collection \'%z\': Records limit reached",&pCol->sName);
    sVar5 = -7;
  }
  else {
    puVar2 = ((pDb->sDB).pPager)->pEngine;
    puVar3 = puVar2->pIo->pMethods;
    if (puVar3->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenErrorFormat
                (pDb,
                 "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine"
                 ,&pCol->sName);
      sVar5 = -0x4b;
    }
    else {
      pBlob = &pCol->sWorker;
      SyBlobReset(pBlob);
      if (((pValue->iFlags & 0x40) != 0) && ((*(byte *)((pValue->x).iVal + 0x40) & 1) != 0)) {
        jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,&sId,pCol->nLastid);
        jx9_array_add_strkey_elem(pValue,"__id",&sId);
        jx9MemObjRelease(&sId);
      }
      SyBlobFormat(pBlob,"%z_%qd",&pCol->sName,pCol->nLastid);
      uVar1 = (pCol->sWorker).nByte;
      if ((ulong)uVar1 == 0) {
        unqliteGenOutofMem(pCol->pVm->pDb);
        sVar5 = -1;
      }
      else {
        sVar5 = FastJsonEncode(pValue,pBlob,0);
        if (sVar5 == 0) {
          pvVar4 = (pCol->sWorker).pBlob;
          sVar5 = (*puVar3->xReplace)(puVar2,pvVar4,uVar1,(void *)((ulong)uVar1 + (long)pvVar4),
                                      (ulong)((pCol->sWorker).nByte - uVar1));
          if (sVar5 == 0) {
            CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
            iRec = pCol->nLastid + 1;
            pCol->nLastid = iRec;
            iTotal = pCol->nTotRec + 1;
            pCol->nTotRec = iTotal;
            sVar5 = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,iRec,iTotal,(jx9_value *)0x0);
            if (sVar5 == 0) {
              return 0;
            }
          }
          unqliteGenErrorFormat
                    (pCol->pVm->pDb,"IO error while storing record into collection \'%z\'",
                     &pCol->sName);
        }
      }
    }
  }
  return sVar5;
}

Assistant:

static int CollectionStore(
	unqlite_col *pCol, /* Target collection */
	jx9_value *pValue  /* JSON value to be stored */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	sxu32 nKeyLen;
	int rc;	
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	if( pCol->nTotRec >= SXI64_HIGH ){
		/* Collection limit reached. No more records */
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Collection '%z': Records limit reached",
				&pCol->sName
			);
		return UNQLITE_LIMIT;
	}
	if( pMethods->xReplace == 0 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot store record into collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
		return UNQLITE_READ_ONLY;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	if( jx9_value_is_json_object(pValue) ){
		jx9_value sId;
		/* If the given type is a JSON object, then add the special __id field */
		jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,&sId,pCol->nLastid);
		jx9_array_add_strkey_elem(pValue,"__id",&sId);
		jx9MemObjRelease(&sId);
	}
	/* Prepare the unique ID for this record */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,pCol->nLastid);
	nKeyLen = SyBlobLength(pWorker);
	if( nKeyLen < 1 ){
		unqliteGenOutofMem(pCol->pVm->pDb);
		return UNQLITE_NOMEM;
	}
	/* Turn to FastJson */
	rc = FastJsonEncode(pValue,pWorker,0);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Finally perform the insertion */
	rc = pMethods->xReplace(
		pEngine,
		SyBlobData(pWorker),nKeyLen,
		SyBlobDataAt(pWorker,nKeyLen),SyBlobLength(pWorker)-nKeyLen
		);
	if( rc == UNQLITE_OK ){
		/* Save the value in the cache */
		CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
		/* Increment the unique __id */
		pCol->nLastid++;
		pCol->nTotRec++;
		/* Reflect the change */
		rc = CollectionSetHeader(0,pCol,pCol->nLastid,pCol->nTotRec,0);
	}
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"IO error while storing record into collection '%z'",
				&pCol->sName
			);
		return rc;
	}
	return UNQLITE_OK;
}